

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::~IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralCurveConnection *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection,_0UL> *)
             &(this->super_IfcStructuralConnection).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20,
             vtt + 0x28);
  IfcStructuralConnection::~IfcStructuralConnection(&this->super_IfcStructuralConnection,vtt + 1);
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}